

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O0

Ref __thiscall
Minisat::RegionAllocator<unsigned_int>::alloc(RegionAllocator<unsigned_int> *this,int size)

{
  uint uVar1;
  undefined8 uVar2;
  int in_ESI;
  long in_RDI;
  RegionAllocator<unsigned_int> *unaff_retaddr;
  uint32_t prev_sz;
  
  capacity(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  uVar1 = *(uint *)(in_RDI + 8);
  *(int *)(in_RDI + 8) = in_ESI + *(int *)(in_RDI + 8);
  if (*(uint *)(in_RDI + 8) < uVar1) {
    uVar2 = __cxa_allocate_exception(1);
    __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
  }
  return uVar1;
}

Assistant:

typename RegionAllocator<T>::Ref RegionAllocator<T>::alloc(int size)
{
    // printf("ALLOC called (this = %p, size = %d)\n", this, size); fflush(stdout);
    assert(size > 0);
    capacity(sz + size);

    uint32_t prev_sz = sz;
    sz += size;

    // Handle overflow:
    if (sz < prev_sz) throw OutOfMemoryException();

    return prev_sz;
}